

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

string * __thiscall
helics::checkBrokerQuery_abi_cxx11_
          (string *__return_storage_ptr__,helics *this,BasicBrokerInfo *brk,string_view query)

{
  ConnectionState state;
  int iVar1;
  string *in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *psVar2;
  undefined4 extraout_var_01;
  string *extraout_RAX;
  int *__s1;
  char *__s;
  size_type __len2;
  
  __s1 = (int *)query._M_len;
  state = (ConnectionState)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (brk == (BasicBrokerInfo *)0x5) {
    iVar1 = bcmp(__s1,"state",5);
    psVar2 = (string *)CONCAT44(extraout_var_01,iVar1);
    if (iVar1 == 0) {
      psVar2 = stateString_abi_cxx11_(state);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(__return_storage_ptr__,psVar2);
      psVar2 = extraout_RAX;
    }
  }
  else {
    if (brk == (BasicBrokerInfo *)0xb) {
      iVar1 = bcmp(__s1,"isconnected",0xb);
      if (iVar1 != 0) {
        return (string *)CONCAT44(extraout_var_00,iVar1);
      }
      __s = "false";
      if (state < (OPERATING|INIT_REQUESTED)) {
        __s = "true";
      }
      __len2 = 5 - (ulong)(state < (OPERATING|INIT_REQUESTED));
    }
    else {
      if (brk != (BasicBrokerInfo *)0x6) {
        return in_RAX;
      }
      __len2 = 4;
      __s = "true";
      if ((short)__s1[1] != 0x7374 || *__s1 != 0x73697865) {
        iVar1 = bcmp(__s1,"isinit",6);
        if (state < OPERATING || iVar1 != 0) {
          return (string *)CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),iVar1 == 0);
        }
      }
    }
    psVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_replace(__return_storage_ptr__,0,0,__s,__len2);
  }
  return psVar2;
}

Assistant:

static std::string checkBrokerQuery(const BasicBrokerInfo& brk, std::string_view query)
{
    std::string response;
    if (query == "exists") {
        response = "true";
    } else if (query == "isconnected") {
        response =
            (brk.state >= ConnectionState::CONNECTED && brk.state <= ConnectionState::OPERATING) ?
            "true" :
            "false";
    } else if (query == "state") {
        response = stateString(brk.state);
    } else if (query == "isinit") {
        if (brk.state >= ConnectionState::OPERATING) {
            response = "true";
            // if it is false we need to actually go check the federate directly
        }
    }
    return response;
}